

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

uint32 heap32b_extr_top(float32 *out_a,uint32 *out_k,float32 *a,uint32 *k,uint32 sz,hcmpfn32b_t cmp)

{
  hcmpfn32b_t cmp_local;
  uint32 sz_local;
  uint32 *k_local;
  float32 *a_local;
  uint32 *out_k_local;
  float32 *out_a_local;
  
  if (sz == 0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/heap.c"
            ,0x99,"Heap underflow\n");
    out_a_local._4_4_ = 0xffffffff;
  }
  else {
    *out_a = *a;
    *out_k = *k;
    *a = a[sz - 1];
    *k = k[sz - 1];
    out_a_local._4_4_ = sz - 1;
    heapify32b(a,k,0,out_a_local._4_4_,cmp);
  }
  return out_a_local._4_4_;
}

Assistant:

uint32
heap32b_extr_top(float32 *out_a,
		 uint32 *out_k,
		 float32 *a, uint32 *k, uint32 sz,
		 hcmpfn32b_t cmp)
{
    if (sz < 1) {
	E_ERROR("Heap underflow\n");
	return NO_KEY;
    }

    *out_a = a[0];
    *out_k = k[0];

    a[0] = a[sz-1];
    k[0] = k[sz-1];

    sz--;

    heapify32b(a, k, 0, sz, cmp);

    return sz;
}